

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall
camp::ClassAlreadyCreated::ClassAlreadyCreated(ClassAlreadyCreated *this,string *name,string *type)

{
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *type_local;
  string *name_local;
  ClassAlreadyCreated *this_local;
  
  local_20 = type;
  type_local = name;
  name_local = (string *)this;
  std::operator+((char *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "a metaclass named ");
  std::operator+(local_80,(char *)local_a0);
  std::operator+(local_60,local_80);
  std::operator+(local_40,(char *)local_60);
  Error::Error(&this->super_Error,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_a0);
  *(undefined ***)&this->super_Error = &PTR__ClassAlreadyCreated_001fd388;
  return;
}

Assistant:

ClassAlreadyCreated::ClassAlreadyCreated(const std::string& name, const std::string& type)
    : Error("a metaclass named " + name + ", or bound to the type " + type + " already exists")
{
}